

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_false>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  NodeRef nodeRef;
  RTCIntersectFunctionN p_Var17;
  byte bVar18;
  byte bVar19;
  uint i;
  long lVar20;
  byte bVar21;
  undefined1 (*pauVar22) [32];
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  bool bVar26;
  byte bVar27;
  ulong uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar49 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  vint<8> mask;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  RTCIntersectFunctionNArguments local_5988;
  Geometry *local_5958;
  undefined8 local_5950;
  RTCIntersectArguments *local_5948;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  uVar23 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar23 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar33 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      uVar28 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40),5);
      uVar24 = vpcmpeqd_avx512vl(auVar33,(undefined1  [32])valid_i->field_0);
      uVar28 = uVar28 & uVar24;
      bVar27 = (byte)uVar28;
      if (bVar27 != 0) {
        auVar33 = *(undefined1 (*) [32])(ray + 0x80);
        auVar30 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar31 = *(undefined1 (*) [32])(ray + 0xc0);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar47 = ZEXT3264(local_4680);
        auVar29 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
        local_58e0._0_4_ =
             (uint)(bVar27 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar27 & 1) * 0x7f800000;
        bVar26 = (bool)((byte)(uVar28 >> 1) & 1);
        local_58e0._4_4_ = (uint)bVar26 * auVar29._4_4_ | (uint)!bVar26 * 0x7f800000;
        bVar26 = (bool)((byte)(uVar28 >> 2) & 1);
        local_58e0._8_4_ = (uint)bVar26 * auVar29._8_4_ | (uint)!bVar26 * 0x7f800000;
        bVar26 = (bool)((byte)(uVar28 >> 3) & 1);
        local_58e0._12_4_ = (uint)bVar26 * auVar29._12_4_ | (uint)!bVar26 * 0x7f800000;
        bVar26 = (bool)((byte)(uVar28 >> 4) & 1);
        local_58e0._16_4_ = (uint)bVar26 * auVar29._16_4_ | (uint)!bVar26 * 0x7f800000;
        bVar26 = (bool)((byte)(uVar28 >> 5) & 1);
        local_58e0._20_4_ = (uint)bVar26 * auVar29._20_4_ | (uint)!bVar26 * 0x7f800000;
        bVar26 = (bool)((byte)(uVar28 >> 6) & 1);
        local_58e0._24_4_ = (uint)bVar26 * auVar29._24_4_ | (uint)!bVar26 * 0x7f800000;
        bVar26 = SUB81(uVar28 >> 7,0);
        local_58e0._28_4_ = (uint)bVar26 * auVar29._28_4_ | (uint)!bVar26 * 0x7f800000;
        auVar48 = ZEXT3264(local_58e0);
        auVar29 = *(undefined1 (*) [32])(ray + 0x20);
        auVar32 = *(undefined1 (*) [32])(ray + 0x40);
        auVar37._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
        auVar37._8_4_ = auVar32._8_4_ ^ 0x80000000;
        auVar37._12_4_ = auVar32._12_4_ ^ 0x80000000;
        auVar37._16_4_ = auVar32._16_4_ ^ 0x80000000;
        auVar37._20_4_ = auVar32._20_4_ ^ 0x80000000;
        auVar37._24_4_ = auVar32._24_4_ ^ 0x80000000;
        auVar37._28_4_ = auVar32._28_4_ ^ 0x80000000;
        bVar21 = ~bVar27;
        local_5810 = 0xfffffffffffffff8;
        local_5808[0] = uVar23;
        local_4660 = local_58e0;
        if (uVar23 != 0xfffffffffffffff8) {
          auVar35._8_4_ = 0x7fffffff;
          auVar35._0_8_ = 0x7fffffff7fffffff;
          auVar35._12_4_ = 0x7fffffff;
          auVar35._16_4_ = 0x7fffffff;
          auVar35._20_4_ = 0x7fffffff;
          auVar35._24_4_ = 0x7fffffff;
          auVar35._28_4_ = 0x7fffffff;
          auVar32 = vandps_avx(auVar33,auVar35);
          auVar41._8_4_ = 0x219392ef;
          auVar41._0_8_ = 0x219392ef219392ef;
          auVar41._12_4_ = 0x219392ef;
          auVar41._16_4_ = 0x219392ef;
          auVar41._20_4_ = 0x219392ef;
          auVar41._24_4_ = 0x219392ef;
          auVar41._28_4_ = 0x219392ef;
          uVar24 = vcmpps_avx512vl(auVar32,auVar41,1);
          bVar26 = (bool)((byte)uVar24 & 1);
          auVar32._0_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar33._0_4_;
          bVar26 = (bool)((byte)(uVar24 >> 1) & 1);
          auVar32._4_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar33._4_4_;
          bVar26 = (bool)((byte)(uVar24 >> 2) & 1);
          auVar32._8_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar33._8_4_;
          bVar26 = (bool)((byte)(uVar24 >> 3) & 1);
          auVar32._12_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar33._12_4_;
          bVar26 = (bool)((byte)(uVar24 >> 4) & 1);
          auVar32._16_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar33._16_4_;
          bVar26 = (bool)((byte)(uVar24 >> 5) & 1);
          auVar32._20_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar33._20_4_;
          bVar26 = (bool)((byte)(uVar24 >> 6) & 1);
          auVar32._24_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar33._24_4_;
          bVar26 = SUB81(uVar24 >> 7,0);
          auVar32._28_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar33._28_4_;
          auVar33 = vandps_avx(auVar30,auVar35);
          uVar24 = vcmpps_avx512vl(auVar33,auVar41,1);
          bVar26 = (bool)((byte)uVar24 & 1);
          auVar34._0_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar30._0_4_;
          bVar26 = (bool)((byte)(uVar24 >> 1) & 1);
          auVar34._4_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar30._4_4_;
          bVar26 = (bool)((byte)(uVar24 >> 2) & 1);
          auVar34._8_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar30._8_4_;
          bVar26 = (bool)((byte)(uVar24 >> 3) & 1);
          auVar34._12_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar30._12_4_;
          bVar26 = (bool)((byte)(uVar24 >> 4) & 1);
          auVar34._16_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar30._16_4_;
          bVar26 = (bool)((byte)(uVar24 >> 5) & 1);
          auVar34._20_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar30._20_4_;
          bVar26 = (bool)((byte)(uVar24 >> 6) & 1);
          auVar34._24_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar30._24_4_;
          bVar26 = SUB81(uVar24 >> 7,0);
          auVar34._28_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar30._28_4_;
          auVar33 = vandps_avx(auVar31,auVar35);
          uVar24 = vcmpps_avx512vl(auVar33,auVar41,1);
          bVar26 = (bool)((byte)uVar24 & 1);
          auVar33._0_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar31._0_4_;
          bVar26 = (bool)((byte)(uVar24 >> 1) & 1);
          auVar33._4_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar31._4_4_;
          bVar26 = (bool)((byte)(uVar24 >> 2) & 1);
          auVar33._8_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar31._8_4_;
          bVar26 = (bool)((byte)(uVar24 >> 3) & 1);
          auVar33._12_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar31._12_4_;
          bVar26 = (bool)((byte)(uVar24 >> 4) & 1);
          auVar33._16_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar31._16_4_;
          bVar26 = (bool)((byte)(uVar24 >> 5) & 1);
          auVar33._20_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar31._20_4_;
          bVar26 = (bool)((byte)(uVar24 >> 6) & 1);
          auVar33._24_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar31._24_4_;
          bVar26 = SUB81(uVar24 >> 7,0);
          auVar33._28_4_ = (uint)bVar26 * 0x219392ef | (uint)!bVar26 * auVar31._28_4_;
          auVar30 = vrcp14ps_avx512vl(auVar32);
          auVar39._8_4_ = 0x3f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar39._12_4_ = 0x3f800000;
          auVar39._16_4_ = 0x3f800000;
          auVar39._20_4_ = 0x3f800000;
          auVar39._24_4_ = 0x3f800000;
          auVar39._28_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar32,auVar30,auVar39);
          auVar31 = vrcp14ps_avx512vl(auVar34);
          auVar15 = vfnmadd213ps_fma(auVar34,auVar31,auVar39);
          auVar32 = vrcp14ps_avx512vl(auVar33);
          auVar16 = vfnmadd213ps_fma(auVar33,auVar32,auVar39);
          auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar31,auVar31);
          auVar45 = ZEXT1664(auVar15);
          auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar30,auVar30);
          auVar44 = ZEXT1664(auVar14);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar32,auVar32);
          auVar46 = ZEXT1664(auVar16);
          puVar25 = local_5808;
          auVar49._0_4_ = auVar14._0_4_ * -*(float *)ray;
          auVar49._4_4_ = auVar14._4_4_ * -*(float *)(ray + 4);
          auVar49._8_4_ = auVar14._8_4_ * -*(float *)(ray + 8);
          auVar49._12_4_ = auVar14._12_4_ * -*(float *)(ray + 0xc);
          auVar49._16_4_ = -*(float *)(ray + 0x10) * 0.0;
          auVar49._20_4_ = -*(float *)(ray + 0x14) * 0.0;
          auVar49._28_36_ = in_ZMM14._28_36_;
          auVar49._24_4_ = -*(float *)(ray + 0x18) * 0.0;
          local_5900 = auVar49._0_32_;
          auVar49 = ZEXT3264(local_5900);
          auVar50._0_4_ = auVar15._0_4_ * -auVar29._0_4_;
          auVar50._4_4_ = auVar15._4_4_ * -auVar29._4_4_;
          auVar50._8_4_ = auVar15._8_4_ * -auVar29._8_4_;
          auVar50._12_4_ = auVar15._12_4_ * -auVar29._12_4_;
          auVar50._16_4_ = -auVar29._16_4_ * 0.0;
          auVar50._20_4_ = -auVar29._20_4_ * 0.0;
          auVar50._28_36_ = in_ZMM15._28_36_;
          auVar50._24_4_ = -auVar29._24_4_ * 0.0;
          local_5920 = auVar50._0_32_;
          auVar50 = ZEXT3264(local_5920);
          local_58c0 = ZEXT1632(auVar16);
          local_5940 = vmulps_avx512vl(local_58c0,auVar37);
          auVar51 = ZEXT3264(local_5940);
          auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar30 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          bVar26 = (bool)((byte)(uVar28 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar28 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar28 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar28 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar28 >> 6) & 1);
          bVar9 = SUB81(uVar28 >> 7,0);
          auVar52 = ZEXT3264(CONCAT428((uint)bVar9 * auVar30._28_4_ | (uint)!bVar9 * auVar33._28_4_,
                                       CONCAT424((uint)bVar8 * auVar30._24_4_ |
                                                 (uint)!bVar8 * auVar33._24_4_,
                                                 CONCAT420((uint)bVar7 * auVar30._20_4_ |
                                                           (uint)!bVar7 * auVar33._20_4_,
                                                           CONCAT416((uint)bVar6 * auVar30._16_4_ |
                                                                     (uint)!bVar6 * auVar33._16_4_,
                                                                     CONCAT412((uint)bVar5 *
                                                                               auVar30._12_4_ |
                                                                               (uint)!bVar5 *
                                                                               auVar33._12_4_,
                                                                               CONCAT48((uint)bVar4
                                                                                        * auVar30.
                                                  _8_4_ | (uint)!bVar4 * auVar33._8_4_,
                                                  CONCAT44((uint)bVar26 * auVar30._4_4_ |
                                                           (uint)!bVar26 * auVar33._4_4_,
                                                           (uint)(bVar27 & 1) * auVar30._0_4_ |
                                                           (uint)!(bool)(bVar27 & 1) * auVar33._0_4_
                                                          ))))))));
          pauVar22 = (undefined1 (*) [32])local_4640;
          local_5880 = ZEXT1632(auVar14);
          local_58a0 = ZEXT1632(auVar15);
          do {
            pauVar1 = pauVar22 + -1;
            auVar36 = ZEXT3264(*pauVar1);
            pauVar22 = pauVar22 + -1;
            auVar33 = auVar52._0_32_;
            uVar11 = vcmpps_avx512vl(*pauVar1,auVar33,1);
            if ((char)uVar11 != '\0') {
LAB_007cd6c0:
              if ((uVar23 & 8) == 0) goto code_r0x007cd6ca;
              if (uVar23 == 0xfffffffffffffff8) break;
              uVar11 = vcmpps_avx512vl(auVar33,auVar36._0_32_,6);
              if ((char)uVar11 != '\0') {
                uVar28 = (ulong)((uint)uVar23 & 0xf);
                bVar18 = bVar21;
                if (uVar28 != 8) {
                  bVar18 = ~bVar21;
                  uVar24 = 1;
                  local_5860 = auVar33;
                  do {
                    local_5988.geomID = *(uint *)(((uVar23 & 0xfffffffffffffff0) - 8) + uVar24 * 8);
                    local_5958 = (context->scene->geometries).items[local_5988.geomID].ptr;
                    uVar3 = local_5958->mask;
                    auVar30._4_4_ = uVar3;
                    auVar30._0_4_ = uVar3;
                    auVar30._8_4_ = uVar3;
                    auVar30._12_4_ = uVar3;
                    auVar30._16_4_ = uVar3;
                    auVar30._20_4_ = uVar3;
                    auVar30._24_4_ = uVar3;
                    auVar30._28_4_ = uVar3;
                    uVar11 = vptestmd_avx512vl(auVar30,*(undefined1 (*) [32])(ray + 0x120));
                    bVar19 = (byte)uVar11 & bVar18;
                    if (bVar19 == 0) {
                      bVar19 = 0xff;
                    }
                    else {
                      local_5988.primID =
                           *(uint *)(((uVar23 & 0xfffffffffffffff0) - 4) + uVar24 * 8);
                      local_5840 = vpmovm2d_avx512vl((ulong)bVar19);
                      local_5988.valid = (int *)local_5840;
                      local_5988.geometryUserPtr = local_5958->userPtr;
                      local_5988.context = context->user;
                      local_5988.N = 8;
                      local_5950 = 0;
                      local_5948 = context->args;
                      p_Var17 = local_5948->intersect;
                      if (p_Var17 == (RTCIntersectFunctionN)0x0) {
                        p_Var17 = (RTCIntersectFunctionN)
                                  local_5958[1].super_RefCount.refCounter.
                                  super___atomic_base<unsigned_long>._M_i;
                      }
                      local_5988.rayhit = (RTCRayHitN *)ray;
                      (*p_Var17)(&local_5988);
                      uVar11 = vcmpps_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                               *(undefined1 (*) [32])(ray + 0x100),0xe);
                      bVar19 = ~(byte)uVar11;
                      auVar44 = ZEXT3264(local_5880);
                      auVar45 = ZEXT3264(local_58a0);
                      auVar46 = ZEXT3264(local_58c0);
                      auVar47 = ZEXT3264(CONCAT428(0x7f800000,
                                                   CONCAT424(0x7f800000,
                                                             CONCAT420(0x7f800000,
                                                                       CONCAT416(0x7f800000,
                                                                                 CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar48 = ZEXT3264(local_58e0);
                      auVar49 = ZEXT3264(local_5900);
                      auVar50 = ZEXT3264(local_5920);
                      auVar51 = ZEXT3264(local_5940);
                      auVar52 = ZEXT3264(local_5860);
                    }
                    auVar33 = auVar52._0_32_;
                    bVar18 = bVar18 & bVar19;
                  } while ((bVar18 != 0) &&
                          (bVar26 = uVar24 < uVar28 - 8, uVar24 = uVar24 + 1, bVar26));
                  bVar18 = ~bVar18;
                }
                bVar21 = bVar21 | bVar18;
                if (bVar21 != 0xff) {
                  auVar30 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar26 = (bool)(bVar21 >> 1 & 1);
                  bVar4 = (bool)(bVar21 >> 2 & 1);
                  bVar5 = (bool)(bVar21 >> 3 & 1);
                  bVar6 = (bool)(bVar21 >> 4 & 1);
                  bVar7 = (bool)(bVar21 >> 5 & 1);
                  bVar8 = (bool)(bVar21 >> 6 & 1);
                  auVar52 = ZEXT3264(CONCAT428((uint)(bVar21 >> 7) * auVar30._28_4_ |
                                               (uint)!(bool)(bVar21 >> 7) * auVar33._28_4_,
                                               CONCAT424((uint)bVar8 * auVar30._24_4_ |
                                                         (uint)!bVar8 * auVar33._24_4_,
                                                         CONCAT420((uint)bVar7 * auVar30._20_4_ |
                                                                   (uint)!bVar7 * auVar33._20_4_,
                                                                   CONCAT416((uint)bVar6 *
                                                                             auVar30._16_4_ |
                                                                             (uint)!bVar6 *
                                                                             auVar33._16_4_,
                                                                             CONCAT412((uint)bVar5 *
                                                                                       auVar30.
                                                  _12_4_ | (uint)!bVar5 * auVar33._12_4_,
                                                  CONCAT48((uint)bVar4 * auVar30._8_4_ |
                                                           (uint)!bVar4 * auVar33._8_4_,
                                                           CONCAT44((uint)bVar26 * auVar30._4_4_ |
                                                                    (uint)!bVar26 * auVar33._4_4_,
                                                                    (uint)(bVar21 & 1) *
                                                                    auVar30._0_4_ |
                                                                    (uint)!(bool)(bVar21 & 1) *
                                                                    auVar33._0_4_))))))));
                  goto LAB_007cd7d9;
                }
                bVar21 = 0xff;
                break;
              }
            }
LAB_007cd7d9:
            uVar23 = puVar25[-1];
            puVar25 = puVar25 + -1;
          } while (uVar23 != 0xfffffffffffffff8);
        }
        bVar21 = bVar21 & bVar27;
        bVar26 = (bool)(bVar21 >> 1 & 1);
        bVar4 = (bool)(bVar21 >> 2 & 1);
        bVar5 = (bool)(bVar21 >> 3 & 1);
        bVar6 = (bool)(bVar21 >> 4 & 1);
        bVar7 = (bool)(bVar21 >> 5 & 1);
        bVar8 = (bool)(bVar21 >> 6 & 1);
        *(uint *)(ray + 0x100) =
             (uint)(bVar21 & 1) * -0x800000 | (uint)!(bool)(bVar21 & 1) * *(int *)(ray + 0x100);
        *(uint *)(ray + 0x104) = (uint)bVar26 * -0x800000 | (uint)!bVar26 * *(int *)(ray + 0x104);
        *(uint *)(ray + 0x108) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x108);
        *(uint *)(ray + 0x10c) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x10c);
        *(uint *)(ray + 0x110) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x110);
        *(uint *)(ray + 0x114) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x114);
        *(uint *)(ray + 0x118) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x118);
        *(uint *)(ray + 0x11c) =
             (uint)(bVar21 >> 7) * -0x800000 | (uint)!(bool)(bVar21 >> 7) * *(int *)(ray + 0x11c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
code_r0x007cd6ca:
  lVar20 = 0;
  uVar28 = 8;
  auVar30 = auVar47._0_32_;
  do {
    uVar24 = *(ulong *)((uVar23 & 0xfffffffffffffff0) + lVar20 * 8);
    if (uVar24 == 8) {
      auVar36 = ZEXT3264(auVar30);
      break;
    }
    uVar2 = *(undefined4 *)(uVar23 + 0x40 + lVar20 * 4);
    auVar31._4_4_ = uVar2;
    auVar31._0_4_ = uVar2;
    auVar31._8_4_ = uVar2;
    auVar31._12_4_ = uVar2;
    auVar31._16_4_ = uVar2;
    auVar31._20_4_ = uVar2;
    auVar31._24_4_ = uVar2;
    auVar31._28_4_ = uVar2;
    auVar15 = vfmadd132ps_fma(auVar31,auVar49._0_32_,auVar44._0_32_);
    uVar2 = *(undefined4 *)(uVar23 + 0x80 + lVar20 * 4);
    auVar29._4_4_ = uVar2;
    auVar29._0_4_ = uVar2;
    auVar29._8_4_ = uVar2;
    auVar29._12_4_ = uVar2;
    auVar29._16_4_ = uVar2;
    auVar29._20_4_ = uVar2;
    auVar29._24_4_ = uVar2;
    auVar29._28_4_ = uVar2;
    auVar14 = vfmadd132ps_fma(auVar29,auVar50._0_32_,auVar45._0_32_);
    uVar2 = *(undefined4 *)(uVar23 + 0xc0 + lVar20 * 4);
    auVar38._4_4_ = uVar2;
    auVar38._0_4_ = uVar2;
    auVar38._8_4_ = uVar2;
    auVar38._12_4_ = uVar2;
    auVar38._16_4_ = uVar2;
    auVar38._20_4_ = uVar2;
    auVar38._24_4_ = uVar2;
    auVar38._28_4_ = uVar2;
    auVar34 = vfmadd132ps_avx512vl(auVar38,auVar51._0_32_,auVar46._0_32_);
    uVar2 = *(undefined4 *)(uVar23 + 0x60 + lVar20 * 4);
    auVar40._4_4_ = uVar2;
    auVar40._0_4_ = uVar2;
    auVar40._8_4_ = uVar2;
    auVar40._12_4_ = uVar2;
    auVar40._16_4_ = uVar2;
    auVar40._20_4_ = uVar2;
    auVar40._24_4_ = uVar2;
    auVar40._28_4_ = uVar2;
    auVar16 = vfmadd132ps_fma(auVar40,auVar49._0_32_,auVar44._0_32_);
    uVar2 = *(undefined4 *)(uVar23 + 0xa0 + lVar20 * 4);
    auVar42._4_4_ = uVar2;
    auVar42._0_4_ = uVar2;
    auVar42._8_4_ = uVar2;
    auVar42._12_4_ = uVar2;
    auVar42._16_4_ = uVar2;
    auVar42._20_4_ = uVar2;
    auVar42._24_4_ = uVar2;
    auVar42._28_4_ = uVar2;
    auVar13 = vfmadd132ps_fma(auVar42,auVar50._0_32_,auVar45._0_32_);
    uVar2 = *(undefined4 *)(uVar23 + 0xe0 + lVar20 * 4);
    auVar43._4_4_ = uVar2;
    auVar43._0_4_ = uVar2;
    auVar43._8_4_ = uVar2;
    auVar43._12_4_ = uVar2;
    auVar43._16_4_ = uVar2;
    auVar43._20_4_ = uVar2;
    auVar43._24_4_ = uVar2;
    auVar43._28_4_ = uVar2;
    auVar35 = vfmadd132ps_avx512vl(auVar43,auVar51._0_32_,auVar46._0_32_);
    auVar31 = vpminsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar16));
    auVar29 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar13));
    auVar31 = vpmaxsd_avx2(auVar31,auVar29);
    auVar29 = vpminsd_avx2(auVar34,auVar35);
    auVar31 = vpmaxsd_avx2(auVar31,auVar29);
    auVar29 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar16));
    auVar32 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar13));
    auVar37 = vpminsd_avx2(auVar29,auVar32);
    auVar29 = vpmaxsd_avx2(auVar34,auVar35);
    auVar32 = vpmaxsd_avx2(auVar31,auVar48._0_32_);
    auVar29 = vpminsd_avx512vl(auVar29,auVar33);
    auVar29 = vpminsd_avx2(auVar37,auVar29);
    uVar12 = vpcmpd_avx512vl(auVar32,auVar29,2);
    if ((byte)uVar12 == 0) {
      auVar36 = ZEXT3264(auVar30);
      uVar24 = uVar28;
    }
    else {
      auVar29 = vblendmps_avx512vl(auVar47._0_32_,auVar31);
      bVar26 = (bool)((byte)uVar12 & 1);
      bVar4 = (bool)((byte)(uVar12 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar12 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar12 >> 6) & 1);
      bVar10 = SUB81(uVar12 >> 7,0);
      auVar36 = ZEXT3264(CONCAT428((uint)bVar10 * auVar29._28_4_ | (uint)!bVar10 * auVar31._28_4_,
                                   CONCAT424((uint)bVar9 * auVar29._24_4_ |
                                             (uint)!bVar9 * auVar31._24_4_,
                                             CONCAT420((uint)bVar8 * auVar29._20_4_ |
                                                       (uint)!bVar8 * auVar31._20_4_,
                                                       CONCAT416((uint)bVar7 * auVar29._16_4_ |
                                                                 (uint)!bVar7 * auVar31._16_4_,
                                                                 CONCAT412((uint)bVar6 *
                                                                           auVar29._12_4_ |
                                                                           (uint)!bVar6 *
                                                                           auVar31._12_4_,
                                                                           CONCAT48((uint)bVar5 *
                                                                                    auVar29._8_4_ |
                                                                                    (uint)!bVar5 *
                                                                                    auVar31._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar4 * auVar29._4_4_ |
                                                  (uint)!bVar4 * auVar31._4_4_,
                                                  (uint)bVar26 * auVar29._0_4_ |
                                                  (uint)!bVar26 * auVar31._0_4_))))))));
      if (uVar28 != 8) {
        *puVar25 = uVar28;
        puVar25 = puVar25 + 1;
        *pauVar22 = auVar30;
        pauVar22 = pauVar22 + 1;
      }
    }
    uVar28 = uVar24;
    lVar20 = lVar20 + 1;
    auVar30 = auVar36._0_32_;
  } while (lVar20 != 8);
  uVar23 = uVar28;
  if (uVar28 == 8) goto LAB_007cd7d9;
  goto LAB_007cd6c0;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }